

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDebug.cpp
# Opt level: O3

HighsStatus debugDebugToHighsStatus(HighsDebugStatus debug_status)

{
  HighsStatus HVar1;
  
  HVar1 = kOk;
  if ((uint)(debug_status + ~kSmallError) < 5) {
    HVar1 = *(HighsStatus *)(&DAT_003c7870 + (ulong)(uint)(debug_status + ~kSmallError) * 4);
  }
  return HVar1;
}

Assistant:

HighsStatus debugDebugToHighsStatus(const HighsDebugStatus debug_status) {
  switch (debug_status) {
    case HighsDebugStatus::kNotChecked:
    case HighsDebugStatus::kOk:
    case HighsDebugStatus::kSmallError:
      return HighsStatus::kOk;
    case HighsDebugStatus::kWarning:
    case HighsDebugStatus::kLargeError:
      return HighsStatus::kWarning;
    case HighsDebugStatus::kError:
    case HighsDebugStatus::kExcessiveError:
    case HighsDebugStatus::kLogicalError:
      return HighsStatus::kError;
    default:
      return HighsStatus::kOk;
  }
}